

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Quantize_x86::forward(Quantize_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint elempack;
  uint _h;
  void *pvVar1;
  size_t sVar2;
  int *piVar3;
  Allocator *pAVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  float *pfVar8;
  char *pcVar9;
  int q;
  uint uVar10;
  uint _elempack;
  ulong uVar11;
  int i;
  ulong uVar12;
  float *pfVar13;
  ncnn *pnVar14;
  int iVar15;
  Mat *pMVar16;
  char *pcVar17;
  long lVar18;
  char *pcVar19;
  byte bVar20;
  long lVar21;
  long lVar22;
  int _w;
  
  elempack = bottom_blob->elempack;
  iVar5 = bottom_blob->dims;
  _w = bottom_blob->w;
  _h = bottom_blob->h;
  lVar21 = (long)(int)elempack;
  if (iVar5 == 3) {
    uVar10 = bottom_blob->c;
    bVar20 = (elempack * uVar10 & 7) == 0 & opt->use_packing_layout;
    sVar6 = 1;
    if (bVar20 != 0) {
      sVar6 = 8;
    }
    _elempack = (uint)sVar6;
    uVar12 = (long)(int)(elempack * uVar10) / (long)(int)_elempack;
    iVar5 = (int)uVar12;
    Mat::create(top_blob,_w,_h,iVar5,sVar6,_elempack,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if ((bVar20 == 1 && elempack == 4) && 0 < iVar5) {
      uVar11 = 0;
      do {
        pnVar14 = (ncnn *)(uVar11 * 2 * bottom_blob->cstep * bottom_blob->elemsize +
                          (long)bottom_blob->data);
        pfVar13 = (float *)((uVar11 * 2 + 1) * bottom_blob->cstep * bottom_blob->elemsize +
                           (long)bottom_blob->data);
        pfVar8 = (float *)(top_blob->cstep * uVar11 * top_blob->elemsize + (long)top_blob->data);
        if ((this->super_Quantize).scale_data_size < 2) {
          pcVar19 = (char *)(this->super_Quantize).scale_data.data;
          piVar3 = (this->super_Quantize).scale_data.refcount;
          pMVar16 = (Mat *)(ulong)(uint)(this->super_Quantize).scale_data.w;
          if (piVar3 == (int *)0x0) goto LAB_004400c8;
          pAVar4 = (this->super_Quantize).scale_data.allocator;
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
          quantize_pack4to8(pnVar14,pfVar13,pfVar8,pcVar19,pMVar16,_h * _w);
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (pAVar4 == (Allocator *)0x0) {
              if (pcVar19 != (char *)0x0) {
                free(pcVar19);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])(pAVar4,pcVar19);
            }
          }
        }
        else {
          pcVar19 = (char *)((this->super_Quantize).scale_data.elemsize * uVar11 * 8 +
                            (long)(this->super_Quantize).scale_data.data);
          pMVar16 = (Mat *)&DAT_00000008;
LAB_004400c8:
          quantize_pack4to8(pnVar14,pfVar13,pfVar8,pcVar19,pMVar16,_h * _w);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != (uVar12 & 0xffffffff));
    }
    if ((0 < (int)uVar10 & ~bVar20 & elempack == 4) == 1) {
      lVar18 = 3;
      uVar12 = 0;
      do {
        sVar6 = top_blob->cstep;
        pvVar1 = top_blob->data;
        sVar2 = top_blob->elemsize;
        pfVar8 = (float *)(sVar6 * (lVar18 + -3) * sVar2 + (long)pvVar1);
        pcVar9 = (char *)((lVar18 + -2) * sVar6 * sVar2 + (long)pvVar1);
        pcVar7 = (char *)((lVar18 + -1) * sVar6 * sVar2 + (long)pvVar1);
        pcVar17 = (char *)(sVar6 * lVar18 * sVar2 + (long)pvVar1);
        pcVar19 = (char *)(this->super_Quantize).scale_data.data;
        pnVar14 = (ncnn *)(bottom_blob->cstep * uVar12 * bottom_blob->elemsize +
                          (long)bottom_blob->data);
        if ((this->super_Quantize).scale_data_size < 2) {
          piVar3 = (this->super_Quantize).scale_data.refcount;
          pMVar16 = (Mat *)(ulong)(uint)(this->super_Quantize).scale_data.w;
          if (piVar3 == (int *)0x0) goto LAB_0044031f;
          pAVar4 = (this->super_Quantize).scale_data.allocator;
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
          quantize_pack4to1(pnVar14,pfVar8,pcVar9,pcVar7,pcVar17,pcVar19,pMVar16,_h * _w);
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (pAVar4 == (Allocator *)0x0) {
              if (pcVar19 != (char *)0x0) {
                free(pcVar19);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])(pAVar4,pcVar19);
            }
          }
        }
        else {
          pcVar19 = pcVar19 + (lVar18 + -3) * (this->super_Quantize).scale_data.elemsize;
          pMVar16 = (Mat *)&DAT_00000004;
LAB_0044031f:
          quantize_pack4to1(pnVar14,pfVar8,pcVar9,pcVar7,pcVar17,pcVar19,pMVar16,_h * _w);
        }
        uVar12 = uVar12 + 1;
        lVar18 = lVar18 + 4;
      } while (uVar10 != uVar12);
    }
    if (elempack != _elempack || (int)uVar10 < 1) {
      return 0;
    }
    lVar18 = 0;
    uVar12 = 0;
    do {
      pnVar14 = (ncnn *)(bottom_blob->cstep * uVar12 * bottom_blob->elemsize +
                        (long)bottom_blob->data);
      pfVar8 = (float *)(top_blob->cstep * uVar12 * top_blob->elemsize + (long)top_blob->data);
      if ((this->super_Quantize).scale_data_size < 2) {
        pcVar19 = (char *)(this->super_Quantize).scale_data.data;
        piVar3 = (this->super_Quantize).scale_data.refcount;
        pMVar16 = (Mat *)(ulong)(uint)(this->super_Quantize).scale_data.w;
        if (piVar3 == (int *)0x0) goto LAB_00440528;
        pAVar4 = (this->super_Quantize).scale_data.allocator;
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
        quantize(pnVar14,pfVar8,pcVar19,pMVar16,_h * _w,elempack);
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (pAVar4 == (Allocator *)0x0) {
            if (pcVar19 != (char *)0x0) {
              free(pcVar19);
            }
          }
          else {
            (*pAVar4->_vptr_Allocator[3])(pAVar4,pcVar19);
          }
        }
      }
      else {
        pcVar19 = (char *)((this->super_Quantize).scale_data.elemsize * lVar18 +
                          (long)(this->super_Quantize).scale_data.data);
        pMVar16 = (Mat *)(ulong)elempack;
LAB_00440528:
        quantize(pnVar14,pfVar8,pcVar19,pMVar16,_h * _w,elempack);
      }
      uVar12 = uVar12 + 1;
      lVar18 = lVar18 + lVar21;
    } while (uVar10 != uVar12);
  }
  else if (iVar5 == 2) {
    bVar20 = (elempack * _h & 7) == 0 & opt->use_packing_layout;
    sVar6 = 1;
    if (bVar20 != 0) {
      sVar6 = 8;
    }
    uVar10 = (uint)sVar6;
    uVar12 = (long)(int)(elempack * _h) / (long)(int)uVar10;
    iVar5 = (int)uVar12;
    Mat::create(top_blob,_w,iVar5,sVar6,uVar10,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if ((bVar20 == 1 && elempack == 4) && 0 < iVar5) {
      uVar11 = 0;
      do {
        lVar18 = (long)bottom_blob->w * bottom_blob->elemsize;
        pnVar14 = (ncnn *)(uVar11 * 2 * lVar18 + (long)bottom_blob->data);
        pfVar13 = (float *)((uVar11 * 2 + 1) * lVar18 + (long)bottom_blob->data);
        pfVar8 = (float *)((long)top_blob->w * uVar11 * top_blob->elemsize + (long)top_blob->data);
        if ((this->super_Quantize).scale_data_size < 2) {
          pcVar19 = (char *)(this->super_Quantize).scale_data.data;
          piVar3 = (this->super_Quantize).scale_data.refcount;
          pMVar16 = (Mat *)(ulong)(uint)(this->super_Quantize).scale_data.w;
          if (piVar3 == (int *)0x0) goto LAB_0043ff2c;
          pAVar4 = (this->super_Quantize).scale_data.allocator;
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
          quantize_pack4to8(pnVar14,pfVar13,pfVar8,pcVar19,pMVar16,_w);
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (pAVar4 == (Allocator *)0x0) {
              if (pcVar19 != (char *)0x0) {
                free(pcVar19);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])(pAVar4,pcVar19);
            }
          }
        }
        else {
          pcVar19 = (char *)((this->super_Quantize).scale_data.elemsize * uVar11 * 8 +
                            (long)(this->super_Quantize).scale_data.data);
          pMVar16 = (Mat *)&DAT_00000008;
LAB_0043ff2c:
          quantize_pack4to8(pnVar14,pfVar13,pfVar8,pcVar19,pMVar16,_w);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != (uVar12 & 0xffffffff));
    }
    if ((0 < (int)_h & ~bVar20 & elempack == 4) == 1) {
      lVar18 = 3;
      uVar12 = 0;
      do {
        pvVar1 = top_blob->data;
        lVar22 = (long)top_blob->w * top_blob->elemsize;
        pfVar8 = (float *)(lVar22 * (lVar18 + -3) + (long)pvVar1);
        pcVar9 = (char *)((lVar18 + -2) * lVar22 + (long)pvVar1);
        pcVar7 = (char *)((lVar18 + -1) * lVar22 + (long)pvVar1);
        pcVar17 = (char *)(lVar22 * lVar18 + (long)pvVar1);
        pcVar19 = (char *)(this->super_Quantize).scale_data.data;
        pnVar14 = (ncnn *)((long)bottom_blob->w * uVar12 * bottom_blob->elemsize +
                          (long)bottom_blob->data);
        if ((this->super_Quantize).scale_data_size < 2) {
          piVar3 = (this->super_Quantize).scale_data.refcount;
          pMVar16 = (Mat *)(ulong)(uint)(this->super_Quantize).scale_data.w;
          if (piVar3 == (int *)0x0) goto LAB_004401dd;
          pAVar4 = (this->super_Quantize).scale_data.allocator;
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
          quantize_pack4to1(pnVar14,pfVar8,pcVar9,pcVar7,pcVar17,pcVar19,pMVar16,_w);
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (pAVar4 == (Allocator *)0x0) {
              if (pcVar19 != (char *)0x0) {
                free(pcVar19);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])(pAVar4,pcVar19);
            }
          }
        }
        else {
          pcVar19 = pcVar19 + (lVar18 + -3) * (this->super_Quantize).scale_data.elemsize;
          pMVar16 = (Mat *)&DAT_00000004;
LAB_004401dd:
          quantize_pack4to1(pnVar14,pfVar8,pcVar9,pcVar7,pcVar17,pcVar19,pMVar16,_w);
        }
        uVar12 = uVar12 + 1;
        lVar18 = lVar18 + 4;
      } while (_h != uVar12);
    }
    if (elempack != uVar10 || (int)_h < 1) {
      return 0;
    }
    lVar18 = 0;
    uVar12 = 0;
    do {
      pnVar14 = (ncnn *)((long)bottom_blob->w * uVar12 * bottom_blob->elemsize +
                        (long)bottom_blob->data);
      pfVar8 = (float *)((long)top_blob->w * uVar12 * top_blob->elemsize + (long)top_blob->data);
      if ((this->super_Quantize).scale_data_size < 2) {
        pcVar19 = (char *)(this->super_Quantize).scale_data.data;
        piVar3 = (this->super_Quantize).scale_data.refcount;
        pMVar16 = (Mat *)(ulong)(uint)(this->super_Quantize).scale_data.w;
        if (piVar3 == (int *)0x0) goto LAB_0044041e;
        pAVar4 = (this->super_Quantize).scale_data.allocator;
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
        quantize(pnVar14,pfVar8,pcVar19,pMVar16,_w,elempack);
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (pAVar4 == (Allocator *)0x0) {
            if (pcVar19 != (char *)0x0) {
              free(pcVar19);
            }
          }
          else {
            (*pAVar4->_vptr_Allocator[3])(pAVar4,pcVar19);
          }
        }
      }
      else {
        pcVar19 = (char *)((this->super_Quantize).scale_data.elemsize * lVar18 +
                          (long)(this->super_Quantize).scale_data.data);
        pMVar16 = (Mat *)(ulong)elempack;
LAB_0044041e:
        quantize(pnVar14,pfVar8,pcVar19,pMVar16,_w,elempack);
      }
      uVar12 = uVar12 + 1;
      lVar18 = lVar18 + lVar21;
    } while (_h != uVar12);
  }
  else {
    if (iVar5 != 1) {
      return 0;
    }
    sVar6 = 8;
    if (opt->use_packing_layout == false) {
      sVar6 = 1;
    }
    if ((elempack * _w & 7) != 0) {
      sVar6 = 1;
    }
    Mat::create(top_blob,(int)(elempack * _w) / (int)sVar6,sVar6,(int)sVar6,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar12 = (long)_w / (long)opt->num_threads;
    uVar11 = 1;
    if (1 < (int)uVar12) {
      uVar11 = uVar12 & 0xffffffff;
    }
    iVar5 = (int)uVar11;
    uVar12 = (long)(_w + iVar5 + -1) / (long)iVar5;
    if ((int)uVar12 < 1) {
      return 0;
    }
    uVar12 = uVar12 & 0xffffffff;
    lVar18 = 0;
    lVar22 = 0;
    do {
      iVar15 = _w;
      if (iVar5 < _w) {
        iVar15 = iVar5;
      }
      _w = -(iVar5 - _w);
      quantize((ncnn *)((long)bottom_blob->data + lVar22),(float *)((long)top_blob->data + lVar18),
               (char *)(this->super_Quantize).scale_data.data,
               (Mat *)(ulong)(uint)(this->super_Quantize).scale_data.w,iVar15 * elempack,1);
      lVar22 = lVar22 + lVar21 * uVar11 * 4;
      lVar18 = lVar18 + lVar21 * uVar11;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  return 0;
}

Assistant:

int Quantize_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    if (dims == 1)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = w * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outw = w * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int wp = std::max(1, w / opt.num_threads);
        const int nn_w = (w + wp - 1) / wp;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_w; ii++)
        {
            const int i = ii * wp;

            const float* ptr = (const float*)bottom_blob + i * elempack;
            signed char* s8ptr = (signed char*)top_blob + i * elempack;

            // assert scale_data_size == 1

            const int size = std::min(w - i, wp) * elempack;

            quantize(ptr, s8ptr, scale_data, size, 1);
        }
    }

    if (dims == 2)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = h * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outh = h * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 2);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 2 + 1);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_i, w);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = bottom_blob.row(i * 2);
                const float* ptr1 = bottom_blob.row(i * 2 + 1);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_i, w);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 4);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 4 + 1);
                signed char* s8ptr2 = top_blob.row<signed char>(i * 4 + 2);
                signed char* s8ptr3 = top_blob.row<signed char>(i * 4 + 3);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_i, w);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_i, w, elempack);
            }
        }
    }

    if (dims == 3)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = channels * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outc = channels * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 2);
                signed char* s8ptr1 = top_blob.channel(q * 2 + 1);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_q, w * h);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* ptr0 = bottom_blob.channel(q * 2);
                const float* ptr1 = bottom_blob.channel(q * 2 + 1);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_q, w * h);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 4);
                signed char* s8ptr1 = top_blob.channel(q * 4 + 1);
                signed char* s8ptr2 = top_blob.channel(q * 4 + 2);
                signed char* s8ptr3 = top_blob.channel(q * 4 + 3);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_q, w * h);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_q, w * h, elempack);
            }
        }
    }

    return 0;
}